

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O3

void __thiscall
vera::Model::setBufferShader(Model *this,string *_name,string *_fragStr,string *_vertStr)

{
  ShaderMap *this_00;
  iterator iVar1;
  Shader *pSVar2;
  mapped_type *ppSVar3;
  
  this_00 = &this->gBuffersShaders;
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Shader_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Shader_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Shader_*>_>_>
          ::find(&this_00->_M_t,_name);
  if ((_Rb_tree_header *)iVar1._M_node ==
      &(this->gBuffersShaders)._M_t._M_impl.super__Rb_tree_header) {
    pSVar2 = (Shader *)operator_new(0x100);
    Shader::Shader(pSVar2);
    ppSVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Shader_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Shader_*>_>_>
              ::operator[](this_00,_name);
    *ppSVar3 = pSVar2;
    iVar1 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Shader_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Shader_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Shader_*>_>_>
            ::find(&this_00->_M_t,_name);
    pSVar2 = *(Shader **)(iVar1._M_node + 2);
  }
  else {
    pSVar2 = *(Shader **)(iVar1._M_node + 2);
    if (pSVar2 == (Shader *)0x0) {
      pSVar2 = (Shader *)operator_new(0x100);
      Shader::Shader(pSVar2);
      *(Shader **)(iVar1._M_node + 2) = pSVar2;
    }
  }
  (*(pSVar2->super_HaveDefines)._vptr_HaveDefines[0xc])(pSVar2,&this->mainShader);
  Shader::setSource(*(Shader **)(iVar1._M_node + 2),_fragStr,_vertStr);
  return;
}

Assistant:

void Model::setBufferShader(const std::string _name, const std::string& _fragStr, const std::string& _vertStr) {
    ShaderMap::iterator it = gBuffersShaders.find(_name);

    if (it == gBuffersShaders.end()) {
        gBuffersShaders[_name] = new Shader();
        it = gBuffersShaders.find(_name);
    }
    else
        if (it->second == nullptr)
            it->second = new Shader();

    it->second->mergeDefines(&mainShader);
    it->second->setSource( _fragStr, _vertStr);
}